

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O3

void cfd::js::api::json::ElementsTransactionJsonApi::EstimateFee
               (EstimateFeeRequest *request,EstimateFeeResponse *response)

{
  pointer pcVar1;
  pointer pSVar2;
  undefined8 uVar3;
  int64_t iVar4;
  pointer pSVar5;
  Amount utxo_fee;
  undefined1 local_638 [23];
  ElementsTransactionApi api;
  Amount tx_fee;
  pointer local_618;
  _func_int *local_610 [5];
  _func_int **local_5e8;
  _func_int **local_5e0;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_> utxos;
  ConfidentialAssetId fee_asset;
  ElementsUtxoAndOption data;
  
  utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&fee_asset);
  pcVar1 = (request->fee_asset_)._M_dataplus._M_p;
  data._0_8_ = &data.field_0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&data,pcVar1,pcVar1 + (request->fee_asset_)._M_string_length);
  uVar3 = data._8_8_;
  if ((undefined1 *)data._0_8_ != &data.field_0x10) {
    operator_delete((void *)data._0_8_);
  }
  if (uVar3 != 0) {
    pcVar1 = (request->fee_asset_)._M_dataplus._M_p;
    _tx_fee = local_610;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tx_fee,pcVar1,pcVar1 + (request->fee_asset_)._M_string_length);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId
              ((ConfidentialAssetId *)&data,(string *)&tx_fee);
    cfd::core::ConfidentialAssetId::operator=(&fee_asset,(ConfidentialAssetId *)&data);
    data._0_8_ = &PTR__ConfidentialAssetId_00a86640;
    if (data._8_8_ != 0) {
      operator_delete((void *)data._8_8_);
    }
    if (_tx_fee != local_610) {
      operator_delete(_tx_fee);
    }
  }
  pSVar5 = (request->select_utxos_).super_JsonVector<cfd::js::api::json::SelectUtxoData>.
           super_vector<cfd::js::api::json::SelectUtxoData,_std::allocator<cfd::js::api::json::SelectUtxoData>_>
           .
           super__Vector_base<cfd::js::api::json::SelectUtxoData,_std::allocator<cfd::js::api::json::SelectUtxoData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (request->select_utxos_).super_JsonVector<cfd::js::api::json::SelectUtxoData>.
           super_vector<cfd::js::api::json::SelectUtxoData,_std::allocator<cfd::js::api::json::SelectUtxoData>_>
           .
           super__Vector_base<cfd::js::api::json::SelectUtxoData,_std::allocator<cfd::js::api::json::SelectUtxoData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar5 != pSVar2) {
    local_5e0 = (_func_int **)&PTR__Txid_00a86520;
    local_5e8 = (_func_int **)&PTR__ConfidentialAssetId_00a86640;
    do {
      memset(&data,0,0x538);
      cfd::UtxoData::UtxoData(&data.utxo);
      data.is_issuance = false;
      data.is_blind_issuance = false;
      data.is_pegin = false;
      data.pegin_btc_tx_size = 0;
      cfd::core::Script::Script(&data.claim_script);
      data.pegin_txoutproof_size = 0;
      _utxo_fee = local_638;
      pcVar1 = (pSVar5->txid_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&utxo_fee,pcVar1,pcVar1 + (pSVar5->txid_)._M_string_length);
      cfd::core::Txid::Txid((Txid *)&tx_fee,(string *)&utxo_fee);
      cfd::core::Txid::operator=((Txid *)&data.field_0x28,(Txid *)&tx_fee);
      _tx_fee = local_5e0;
      if (local_618 != (pointer)0x0) {
        operator_delete(local_618);
      }
      if (_utxo_fee != local_638) {
        operator_delete(_utxo_fee);
      }
      data._72_4_ = pSVar5->vout_;
      pcVar1 = (pSVar5->asset_)._M_dataplus._M_p;
      _tx_fee = local_610;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&tx_fee,pcVar1,pcVar1 + (pSVar5->asset_)._M_string_length);
      if (_tx_fee != local_610) {
        operator_delete(_tx_fee);
      }
      if (local_618 != (pointer)0x0) {
        _utxo_fee = local_638;
        pcVar1 = (pSVar5->asset_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&utxo_fee,pcVar1,pcVar1 + (pSVar5->asset_)._M_string_length);
        cfd::core::ConfidentialAssetId::ConfidentialAssetId
                  ((ConfidentialAssetId *)&tx_fee,(string *)&utxo_fee);
        cfd::core::ConfidentialAssetId::operator=
                  ((ConfidentialAssetId *)&data.field_0x278,(ConfidentialAssetId *)&tx_fee);
        _tx_fee = local_5e8;
        if (local_618 != (pointer)0x0) {
          operator_delete(local_618);
        }
        if (_utxo_fee != local_638) {
          operator_delete(_utxo_fee);
        }
      }
      pcVar1 = (pSVar5->redeem_script_)._M_dataplus._M_p;
      _tx_fee = local_610;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&tx_fee,pcVar1,pcVar1 + (pSVar5->redeem_script_)._M_string_length);
      if (_tx_fee != local_610) {
        operator_delete(_tx_fee);
      }
      if (local_618 != (pointer)0x0) {
        _utxo_fee = local_638;
        pcVar1 = (pSVar5->redeem_script_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&utxo_fee,pcVar1,pcVar1 + (pSVar5->redeem_script_)._M_string_length);
        cfd::core::Script::Script((Script *)&tx_fee,(string *)&utxo_fee);
        cfd::core::Script::operator=((Script *)&data.field_0x88,(Script *)&tx_fee);
        core::Script::~Script((Script *)&tx_fee);
        if (_utxo_fee != local_638) {
          operator_delete(_utxo_fee);
        }
      }
      pcVar1 = (pSVar5->descriptor_)._M_dataplus._M_p;
      _tx_fee = local_610;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&tx_fee,pcVar1,pcVar1 + (pSVar5->descriptor_)._M_string_length);
      std::__cxx11::string::operator=((string *)&data.field_0x238,(string *)&tx_fee);
      if (_tx_fee != local_610) {
        operator_delete(_tx_fee);
      }
      data._624_8_ = 0;
      pcVar1 = (pSVar5->script_sig_template_)._M_dataplus._M_p;
      _tx_fee = local_610;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&tx_fee,pcVar1,pcVar1 + (pSVar5->script_sig_template_)._M_string_length);
      if (_tx_fee != local_610) {
        operator_delete(_tx_fee);
      }
      if (local_618 != (pointer)0x0) {
        _utxo_fee = local_638;
        pcVar1 = (pSVar5->script_sig_template_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&utxo_fee,pcVar1,
                   pcVar1 + (pSVar5->script_sig_template_)._M_string_length);
        cfd::core::Script::Script((Script *)&tx_fee,(string *)&utxo_fee);
        cfd::core::Script::operator=((Script *)&data.field_0x4b8,(Script *)&tx_fee);
        core::Script::~Script((Script *)&tx_fee);
        if (_utxo_fee != local_638) {
          operator_delete(_utxo_fee);
        }
      }
      data.is_issuance = pSVar5->is_issuance_;
      data.is_blind_issuance = pSVar5->is_blind_issuance_;
      data.is_pegin = pSVar5->is_pegin_;
      data.pegin_btc_tx_size = (uint32_t)pSVar5->pegin_btc_tx_size_;
      data.pegin_txoutproof_size = pSVar5->pegin_tx_out_proof_size_;
      pcVar1 = (pSVar5->claim_script_)._M_dataplus._M_p;
      _tx_fee = local_610;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&tx_fee,pcVar1,pcVar1 + (pSVar5->claim_script_)._M_string_length);
      if (_tx_fee != local_610) {
        operator_delete(_tx_fee);
      }
      if (local_618 == (pointer)0x0) {
        pcVar1 = (pSVar5->fedpeg_script_)._M_dataplus._M_p;
        _tx_fee = local_610;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&tx_fee,pcVar1,pcVar1 + (pSVar5->fedpeg_script_)._M_string_length);
        if (_tx_fee != local_610) {
          operator_delete(_tx_fee);
        }
      }
      else {
        _utxo_fee = local_638;
        pcVar1 = (pSVar5->claim_script_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&utxo_fee,pcVar1,pcVar1 + (pSVar5->claim_script_)._M_string_length);
        cfd::core::Script::Script((Script *)&tx_fee,(string *)&utxo_fee);
        cfd::core::Script::operator=(&data.claim_script,(Script *)&tx_fee);
        core::Script::~Script((Script *)&tx_fee);
        if (_utxo_fee != local_638) {
          operator_delete(_utxo_fee);
        }
      }
      std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
      ::push_back(&utxos,&data);
      core::Script::~Script(&data.claim_script);
      UtxoData::~UtxoData(&data.utxo);
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar2);
  }
  cfd::core::Amount::Amount(&tx_fee);
  cfd::core::Amount::Amount(&utxo_fee);
  pcVar1 = (request->tx_)._M_dataplus._M_p;
  data._0_8_ = &data.field_0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&data,pcVar1,pcVar1 + (request->tx_)._M_string_length);
  cfd::api::ElementsTransactionApi::EstimateFee
            ((string *)&api,(vector *)&data,(ConfidentialAssetId *)&utxos,(Amount *)&fee_asset,
             &tx_fee,SUB81(&utxo_fee,0),request->fee_rate_,(uint)request->is_blind_,
             request->exponent_,(uint *)(ulong)(uint)request->minimum_bits_);
  if ((undefined1 *)data._0_8_ != &data.field_0x10) {
    operator_delete((void *)data._0_8_);
  }
  iVar4 = cfd::core::Amount::GetSatoshiValue();
  response->fee_amount_ = iVar4;
  iVar4 = cfd::core::Amount::GetSatoshiValue();
  response->tx_fee_amount_ = iVar4;
  iVar4 = cfd::core::Amount::GetSatoshiValue();
  response->txout_fee_amount_ = iVar4;
  iVar4 = cfd::core::Amount::GetSatoshiValue();
  response->utxo_fee_amount_ = iVar4;
  fee_asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00a86640;
  if (fee_asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fee_asset.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&utxos);
  return;
}

Assistant:

void ElementsTransactionJsonApi::EstimateFee(
    EstimateFeeRequest* request, EstimateFeeResponse* response) {
  std::vector<ElementsUtxoAndOption> utxos;

  // elements only.
  ConfidentialAssetId fee_asset;
  if (!request->GetFeeAsset().empty()) {
    fee_asset = ConfidentialAssetId(request->GetFeeAsset());
  }

  for (auto& utxo : request->GetSelectUtxos()) {
    ElementsUtxoAndOption data = {};
    data.utxo.txid = Txid(utxo.GetTxid());
    data.utxo.vout = utxo.GetVout();
    if (!utxo.GetAsset().empty()) {
      data.utxo.asset = ConfidentialAssetId(utxo.GetAsset());
    }
    if (!utxo.GetRedeemScript().empty()) {
      data.utxo.redeem_script = Script(utxo.GetRedeemScript());
    }
    data.utxo.descriptor = utxo.GetDescriptor();
    data.utxo.binary_data = nullptr;
    if (!utxo.GetScriptSigTemplate().empty()) {
      data.utxo.scriptsig_template = Script(utxo.GetScriptSigTemplate());
    }

    data.is_issuance = utxo.GetIsIssuance();
    data.is_blind_issuance = utxo.GetIsBlindIssuance();
    data.is_pegin = utxo.GetIsPegin();
    data.pegin_btc_tx_size = utxo.GetPeginBtcTxSize();
    data.pegin_txoutproof_size = utxo.GetPeginTxOutProofSize();
    if (!utxo.GetClaimScript().empty()) {
      data.claim_script = Script(utxo.GetClaimScript());
    } else if (!utxo.GetFedpegScript().empty()) {
      data.claim_script = Script(utxo.GetFedpegScript());
    }
    utxos.push_back(data);
  }

  Amount tx_fee;
  Amount utxo_fee;
  ElementsTransactionApi api;
  Amount fee = api.EstimateFee(
      request->GetTx(), utxos, fee_asset, &tx_fee, &utxo_fee,
      request->GetIsBlind(), request->GetFeeRate(), request->GetExponent(),
      request->GetMinimumBits());

  response->SetFeeAmount(fee.GetSatoshiValue());
  response->SetTxFeeAmount(tx_fee.GetSatoshiValue());
  response->SetTxoutFeeAmount(tx_fee.GetSatoshiValue());
  response->SetUtxoFeeAmount(utxo_fee.GetSatoshiValue());
}